

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

string * __thiscall
spvtools::val::(anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ValidationState_t *_,
          Instruction *inst)

{
  uint32_t firstWord;
  spv_result_t sVar1;
  AssemblyGrammar *this_00;
  ostringstream local_1a8 [8];
  ostringstream ss;
  allocator<char> local_29;
  spv_ext_inst_desc local_28;
  spv_ext_inst_desc desc;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_28 = (spv_ext_inst_desc)0x0;
  desc = (spv_ext_inst_desc)_;
  inst_local = (Instruction *)this;
  __local = (ValidationState_t *)__return_storage_ptr__;
  this_00 = ValidationState_t::grammar((ValidationState_t *)this);
  firstWord = val::Instruction::word((Instruction *)desc,4);
  sVar1 = AssemblyGrammar::lookupExtInst
                    (this_00,SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION,firstWord,&local_28);
  if ((sVar1 == SPV_SUCCESS) && (local_28 != (spv_ext_inst_desc)0x0)) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,local_28->name);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown ExtInst",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReflectionInstructionName(ValidationState_t& _,
                                      const Instruction* inst) {
  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION,
                                inst->word(4), &desc) != SPV_SUCCESS ||
      !desc) {
    return std::string("Unknown ExtInst");
  }
  std::ostringstream ss;
  ss << desc->name;

  return ss.str();
}